

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O1

vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> * __thiscall
mxx::gatherv<TwoBSA<unsigned_long>>
          (vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
           *__return_storage_ptr__,mxx *this,TwoBSA<unsigned_long> *data,size_t size,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes,int root,comm *comm)

{
  int *piVar1;
  uint uVar2;
  ulong __new_size;
  undefined4 in_register_0000008c;
  
  (__return_storage_ptr__->
  super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  piVar1 = *(int **)size;
  __new_size = 0;
  if (piVar1 != *(int **)(size + 8)) {
    do {
      uVar2 = (int)__new_size + *piVar1;
      __new_size = (ulong)uVar2;
      piVar1 = piVar1 + 2;
    } while (piVar1 != *(int **)(size + 8));
    __new_size = (ulong)(int)uVar2;
  }
  if (((comm *)CONCAT44(in_register_0000008c,root))->m_rank == (int)recv_sizes) {
    std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::resize
              (__return_storage_ptr__,__new_size);
  }
  gatherv<TwoBSA<unsigned_long>>
            ((TwoBSA<unsigned_long> *)this,(size_t)data,
             (__return_storage_ptr__->
             super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>).
             _M_impl.super__Vector_impl_data._M_start,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)size,(int)recv_sizes,
             (comm *)CONCAT44(in_register_0000008c,root));
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> gatherv(const T* data, size_t size, const std::vector<size_t>& recv_sizes, int root, const mxx::comm& comm = mxx::comm()) {
    std::vector<T> result;
    size_t total_size = std::accumulate(recv_sizes.begin(), recv_sizes.end(), 0);
    if (comm.rank() == root)
        result.resize(total_size);
    gatherv(data, size, &result[0], recv_sizes, root, comm);
    return result;
}